

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void tlb_reset_dirty_m68k(CPUState *cpu,ram_addr_t start1,ram_addr_t length)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  
  pvVar2 = cpu->env_ptr;
  lVar5 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    uVar7 = (int)(*(ulong *)((long)pvVar2 + lVar5 * 0x10 + -0x30) >> 6) + 1;
    if (uVar7 != 0) {
      lVar8 = 0;
      do {
        lVar6 = *(long *)((long)pvVar2 + lVar5 * 0x10 + -0x28);
        uVar1 = *(uint *)(lVar6 + 4 + lVar8);
        if (((uVar1 & 0xe40) == 0) &&
           (((uVar1 & 0xfffff000) - start1) + *(long *)(lVar6 + 0x10 + lVar8) < length)) {
          *(uint *)(lVar6 + 4 + lVar8) = uVar1 | 0x400;
        }
        lVar8 = lVar8 + 0x40;
      } while ((ulong)uVar7 << 6 != lVar8);
    }
    lVar8 = lVar5 * 0x2b0 + -0x564;
    lVar6 = 0;
    do {
      uVar7 = *(uint *)((long)pvVar2 + lVar6 + lVar8);
      if (((uVar7 & 0xe40) == 0) &&
         (((uVar7 & 0xfffff000) - start1) + *(long *)((long)pvVar2 + lVar6 + lVar5 * 0x2b0 + -0x558)
          < length)) {
        *(uint *)((long)pvVar2 + lVar6 + lVar8) = uVar7 | 0x400;
      }
      lVar6 = lVar6 + 0x40;
    } while (lVar6 != 0x200);
    lVar5 = 1;
    bVar3 = false;
  } while (bVar4);
  return;
}

Assistant:

void tlb_reset_dirty(CPUState *cpu, ram_addr_t start1, ram_addr_t length)
{
    struct uc_struct *uc = cpu->uc;
    CPUArchState *env;

    int mmu_idx;

    env = cpu->env_ptr;
    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        unsigned int i;
        unsigned int n = tlb_n_entries(&env_tlb(env)->f[mmu_idx]);

        for (i = 0; i < n; i++) {
            tlb_reset_dirty_range_locked(uc, &env_tlb(env)->f[mmu_idx].table[i],
                                         start1, length);
        }

        for (i = 0; i < CPU_VTLB_SIZE; i++) {
            tlb_reset_dirty_range_locked(uc, &env_tlb(env)->d[mmu_idx].vtable[i],
                                         start1, length);
        }
    }
}